

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void apply_imputation_results<PredictionData<double,unsigned_long>,ImputedData<unsigned_long,double>>
               (PredictionData<double,_unsigned_long> *prediction_data,
               ImputedData<unsigned_long,_double> *imp,Imputer *imputer,size_t row)

{
  double dVar1;
  bool bVar2;
  size_t sVar3;
  pointer puVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  unsigned_long uVar8;
  ulong uVar9;
  pointer pvVar10;
  pointer pvVar11;
  int *piVar12;
  pointer piVar13;
  double *pdVar14;
  double *pdVar15;
  size_t sVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  size_t sVar23;
  double dVar24;
  
  bVar2 = prediction_data->is_col_major;
  sVar3 = imp->n_missing_num;
  if (bVar2 == false) {
    if (sVar3 != 0) {
      puVar4 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar16 = imputer->ncols_numeric;
      pdVar22 = prediction_data->numeric_data;
      pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar23 = 0;
      do {
        uVar8 = puVar4[sVar23];
        dVar1 = pdVar6[sVar23];
        if (((dVar1 <= 0.0) || (dVar24 = pdVar5[sVar23], 0x7fefffffffffffff < (ulong)ABS(dVar24)))
           || ((dVar24 == 0.0 && ((!NAN(dVar24) && (NAN(pdVar7[uVar8]))))))) {
          dVar24 = pdVar7[uVar8];
        }
        else {
          dVar24 = dVar24 / dVar1;
        }
        pdVar22[sVar16 * row + uVar8] = dVar24;
        sVar23 = sVar23 + 1;
      } while (sVar3 != sVar23);
    }
  }
  else if (sVar3 != 0) {
    puVar4 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar22 = prediction_data->numeric_data;
    sVar16 = prediction_data->nrows;
    sVar23 = 0;
    do {
      uVar8 = puVar4[sVar23];
      dVar1 = pdVar6[sVar23];
      if (((dVar1 <= 0.0) || (dVar24 = pdVar5[sVar23], 0x7fefffffffffffff < (ulong)ABS(dVar24))) ||
         ((dVar24 == 0.0 && ((!NAN(dVar24) && (NAN(pdVar7[uVar8]))))))) {
        dVar24 = pdVar7[uVar8];
      }
      else {
        dVar24 = dVar24 / dVar1;
      }
      pdVar22[row + uVar8 * sVar16] = dVar24;
      sVar23 = sVar23 + 1;
    } while (sVar3 != sVar23);
  }
  pdVar22 = prediction_data->Xr;
  if (pdVar22 != (double *)0x0) {
    uVar17 = prediction_data->Xr_indptr[row];
    uVar9 = prediction_data->Xr_indptr[row + 1];
    if (uVar17 < uVar9) {
      pdVar5 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar19 = 0;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar22[uVar17])) {
          dVar1 = pdVar6[lVar19];
          if ((dVar1 <= 0.0) || (dVar24 = pdVar5[lVar19], 0x7fefffffffffffff < (ulong)ABS(dVar24)))
          {
            dVar24 = pdVar7[puVar4[lVar19]];
          }
          else {
            dVar24 = dVar24 / dVar1;
          }
          pdVar22[uVar17] = dVar24;
          lVar19 = lVar19 + 1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar9 != uVar17);
    }
  }
  sVar3 = imp->n_missing_cat;
  if (bVar2 == false) {
    if (sVar3 != 0) {
      puVar4 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar19 = row * imputer->ncols_categ;
      pvVar10 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar12 = prediction_data->categ_data;
      pvVar11 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      piVar13 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar16 = 0;
      do {
        uVar8 = puVar4[sVar16];
        pdVar14 = pvVar10[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar15 = pvVar10[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar22 = pdVar14 + 1;
        pdVar20 = pdVar14;
        pdVar21 = pdVar14;
        if (pdVar22 != pdVar15 && pdVar14 != pdVar15) {
          do {
            pdVar21 = pdVar22;
            if (*pdVar22 < *pdVar20 || *pdVar22 == *pdVar20) {
              pdVar21 = pdVar20;
            }
            pdVar22 = pdVar22 + 1;
            pdVar20 = pdVar21;
          } while (pdVar22 != pdVar15);
        }
        iVar18 = (int)((ulong)((long)pdVar21 - (long)pdVar14) >> 3);
        piVar12[lVar19 + uVar8] = iVar18;
        if (iVar18 == 0) {
          iVar18 = -1;
          if ((pdVar14 != pdVar15) && (pvVar10 != pvVar11)) {
            if (0.0 < *pdVar14) goto LAB_002506f6;
            iVar18 = piVar13[uVar8];
          }
          piVar12[lVar19 + uVar8] = iVar18;
        }
LAB_002506f6:
        sVar16 = sVar16 + 1;
      } while (sVar16 != sVar3);
    }
  }
  else if (sVar3 != 0) {
    puVar4 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar10 = (imp->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar11 = (imp->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    piVar12 = prediction_data->categ_data;
    sVar16 = prediction_data->nrows;
    piVar13 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar23 = 0;
    do {
      uVar8 = puVar4[sVar23];
      pdVar14 = pvVar10[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar15 = pvVar10[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pdVar22 = pdVar14 + 1;
      pdVar20 = pdVar14;
      pdVar21 = pdVar14;
      if (pdVar22 != pdVar15 && pdVar14 != pdVar15) {
        do {
          pdVar20 = pdVar22;
          if (*pdVar22 < *pdVar21 || *pdVar22 == *pdVar21) {
            pdVar20 = pdVar21;
          }
          pdVar22 = pdVar22 + 1;
          pdVar21 = pdVar20;
        } while (pdVar22 != pdVar15);
      }
      lVar19 = sVar16 * uVar8;
      iVar18 = (int)((ulong)((long)pdVar20 - (long)pdVar14) >> 3);
      piVar12[row + lVar19] = iVar18;
      if (iVar18 == 0) {
        iVar18 = -1;
        if ((pdVar14 != pdVar15) && (pvVar10 != pvVar11)) {
          if (0.0 < *pdVar14) goto LAB_00250636;
          iVar18 = piVar13[uVar8];
        }
        piVar12[row + lVar19] = iVar18;
      }
LAB_00250636:
      sVar23 = sVar23 + 1;
    } while (sVar23 != sVar3);
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}